

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,LinkLibraryType llt)

{
  cmMakefile *pcVar1;
  cmTarget *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  cmake *this_00;
  size_type sVar6;
  PolicyID id;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  pointer pbVar10;
  MessageType t;
  allocator local_1e9;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  string prop;
  
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&prop,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator *)&local_1e8);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&prop);
    std::__cxx11::string::~string((string *)&prop);
    return false;
  }
  uVar7 = this->CurrentProcessingState - ProcessingKeywordLinkInterface;
  bVar3 = cmTarget::PushTLLCommandTrace(this->Target,(uint)(4 < uVar7));
  if (bVar3) goto LAB_002cf8d5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
  if (PVar4 - NEW < 3) {
    t = FATAL_ERROR;
    bVar3 = true;
    pcVar9 = "must";
LAB_002cf7fd:
    poVar5 = std::operator<<((ostream *)&prop,"The ");
    pcVar8 = "keyword";
    if (uVar7 < 5) {
      pcVar8 = "plain";
    }
    poVar5 = std::operator<<(poVar5,pcVar8);
    poVar5 = std::operator<<(poVar5,
                             " signature for target_link_libraries has already been used with the target \""
                            );
    poVar5 = std::operator<<(poVar5,(string *)&this->Target->Name);
    poVar5 = std::operator<<(poVar5,"\".  All uses of target_link_libraries with a target ");
    poVar5 = std::operator<<(poVar5,pcVar9);
    std::operator<<(poVar5," be either all-keyword or all-plain.\n");
    cmTarget::GetTllSignatureTraces(this->Target,(ostringstream *)&prop,(uint)(uVar7 < 5));
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,t,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (bVar3) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop);
      return false;
    }
  }
  else if (PVar4 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x17,id);
    poVar5 = std::operator<<((ostream *)&prop,(string *)&local_1e8);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    bVar3 = false;
    pcVar9 = "should";
    t = AUTHOR_WARNING;
    goto LAB_002cf7fd;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop);
LAB_002cf8d5:
  if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
    cmMakefile::AddLinkLibraryForTarget
              ((this->super_cmCommand).Makefile,&this->Target->Name,lib,llt);
    if (1 < this->CurrentProcessingState - ProcessingPlainPublicInterface) {
      if (this->CurrentProcessingState == ProcessingLinkLibraries) {
        pcVar2 = this->Target;
        std::__cxx11::string::string
                  ((string *)&prop,"INTERFACE_LINK_LIBRARIES",(allocator *)&debugConfigs);
        cmTarget::GetDebugGeneratorExpressions(&local_1e8,this->Target,lib,llt);
        cmTarget::AppendProperty(pcVar2,&prop,local_1e8._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&prop);
        return true;
      }
      if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
        return true;
      }
      cmTarget::GetDebugGeneratorExpressions(&prop,this->Target,lib,llt);
      bVar3 = cmGeneratorExpression::IsValidTargetName(lib);
      if ((bVar3) || (sVar6 = cmGeneratorExpression::Find(lib), sVar6 != 0xffffffffffffffff)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugConfigs,"$<LINK_ONLY:",&prop);
        std::operator+(&local_1e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugConfigs,">");
        std::__cxx11::string::operator=((string *)&prop,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&debugConfigs);
      }
      pcVar2 = this->Target;
      std::__cxx11::string::string
                ((string *)&local_1e8,"INTERFACE_LINK_LIBRARIES",(allocator *)&debugConfigs);
      cmTarget::AppendProperty(pcVar2,&local_1e8,prop._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&prop);
      return true;
    }
  }
  pcVar2 = this->Target;
  std::__cxx11::string::string
            ((string *)&prop,"INTERFACE_LINK_LIBRARIES",(allocator *)&debugConfigs);
  cmTarget::GetDebugGeneratorExpressions(&local_1e8,this->Target,lib,llt);
  cmTarget::AppendProperty(pcVar2,&prop,local_1e8._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&prop);
  PVar4 = cmTarget::GetPolicyStatusCMP0022(this->Target);
  if ((PVar4 < NEW) && (this->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,this_00);
    prop._M_dataplus._M_p = (pointer)&prop.field_2;
    prop._M_string_length = 0;
    prop.field_2._M_local_buf[0] = '\0';
    if (llt < OPTIMIZED) {
      for (pbVar10 = debugConfigs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 !=
          debugConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
        std::__cxx11::string::assign((char *)&prop);
        std::__cxx11::string::append((string *)&prop);
        cmTarget::AppendProperty(this->Target,&prop,(lib->_M_dataplus)._M_p,false);
      }
    }
    if ((llt & ~OPTIMIZED) == GENERAL) {
      pcVar2 = this->Target;
      std::__cxx11::string::string((string *)&local_1e8,"LINK_INTERFACE_LIBRARIES",&local_1e9);
      cmTarget::AppendProperty(pcVar2,&local_1e8,(lib->_M_dataplus)._M_p,false);
      std::__cxx11::string::~string((string *)&local_1e8);
      for (pbVar10 = debugConfigs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 !=
          debugConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
        std::__cxx11::string::assign((char *)&prop);
        std::__cxx11::string::append((string *)&prop);
        pcVar9 = cmTarget::GetProperty(this->Target,&prop);
        if (pcVar9 == (char *)0x0) {
          cmTarget::SetProperty(this->Target,&prop,"");
        }
      }
    }
    std::__cxx11::string::~string((string *)&prop);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugConfigs);
  }
  return true;
}

Assistant:

bool
cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                            cmTarget::LinkLibraryType llt)
{
  if(this->Target->GetType() == cmTarget::INTERFACE_LIBRARY
      && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
    }

  cmTarget::TLLSignature sig =
        (this->CurrentProcessingState == ProcessingPlainPrivateInterface
      || this->CurrentProcessingState == ProcessingPlainPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordPrivateInterface
      || this->CurrentProcessingState == ProcessingKeywordPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordLinkInterface)
        ? cmTarget::KeywordTLLSignature : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(sig))
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0023))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }

      if(modal)
        {
        // If the sig is a keyword form and there is a conflict, the existing
        // form must be the plain form.
        const char *existingSig
                    = (sig == cmTarget::KeywordTLLSignature ? "plain"
                                                            : "keyword");
          e <<
            "The " << existingSig << " signature for target_link_libraries "
            "has already been used with the target \""
          << this->Target->GetName() << "\".  All uses of "
             "target_link_libraries with a target " << modal << " be either "
             "all-keyword or all-plain.\n";
        this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
        this->Makefile->IssueMessage(messageType, e.str());
        if(messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
    }

  // Handle normal case first.
  if(this->CurrentProcessingState != ProcessingKeywordLinkInterface
      && this->CurrentProcessingState != ProcessingPlainLinkInterface)
    {
    this->Makefile
      ->AddLinkLibraryForTarget(this->Target->GetName(), lib, llt);
    if(this->CurrentProcessingState == ProcessingLinkLibraries)
      {
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
      }
    else if(this->CurrentProcessingState != ProcessingKeywordPublicInterface
            && this->CurrentProcessingState != ProcessingPlainPublicInterface)
      {
      if (this->Target->GetType() == cmTarget::STATIC_LIBRARY)
        {
        std::string configLib = this->Target
                                     ->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib)
            || cmGeneratorExpression::Find(lib) != std::string::npos)
          {
          configLib = "$<LINK_ONLY:" + configLib + ">";
          }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
        }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
      }
    }

  this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
              this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD
      && policy22Status != cmPolicies::WARN)
    {
    return true;
    }

  if (this->Target->GetType() == cmTarget::INTERFACE_LIBRARY)
    {
    return true;
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if(llt == cmTarget::DEBUG || llt == cmTarget::GENERAL)
    {
    // Put in the DEBUG configuration interfaces.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
      }
    }
  if(llt == cmTarget::OPTIMIZED || llt == cmTarget::GENERAL)
    {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if(!this->Target->GetProperty(prop))
        {
        this->Target->SetProperty(prop, "");
        }
      }
    }
  return true;
}